

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O2

void MeshLib::Trait::updateTraitString(string *traitString,string *traitName,string *traitValue)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_b0," ",traitName);
  std::operator+(&local_70,&local_b0,"=(");
  iVar1 = std::__cxx11::string::find((string *)traitString,(ulong)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_70,traitName,"=(");
  iVar2 = std::__cxx11::string::find((string *)traitString,(ulong)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (iVar1 == -1 && iVar2 != 0) {
    if (traitString->_M_string_length == 0) {
      std::operator+(&local_90,traitName,"=(");
      std::operator+(&local_b0,&local_90,traitValue);
      std::operator+(&local_70,&local_b0,")");
      std::__cxx11::string::operator=((string *)traitString,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
      this = &local_90;
    }
    else {
      std::operator+(&local_50,traitName,"=(");
      std::operator+(&local_90,&local_50,traitValue);
      std::operator+(&local_b0,&local_90,") ");
      std::operator+(&local_70,&local_b0,traitString);
      std::__cxx11::string::operator=((string *)traitString,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      this = &local_50;
    }
    std::__cxx11::string::~string((string *)this);
  }
  else {
    uVar3 = std::__cxx11::string::find_first_of((char *)traitString,0x1152fa);
    iVar1 = std::__cxx11::string::find_first_of((char *)traitString,0x1152b4);
    if (uVar3 == 0xffffffff || iVar1 == -1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"ERROR: Trait string missing parenthesis: ");
      poVar4 = std::operator<<(poVar4,(string *)traitString);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      std::__cxx11::string::replace
                ((ulong)traitString,(long)(int)(uVar3 + 1),(string *)(long)(int)(iVar1 + ~uVar3));
    }
  }
  return;
}

Assistant:

void Trait::updateTraitString(std::string &traitString, std::string &traitName, std::string &traitValue)
{
	int sp, ep, sfp;
	sfp = (int)traitString.find(" "+traitName+"=(");
	sp = (int)traitString.find(traitName+"=(");
	if(sp==0 || sfp != (int)std::string::npos)
	{
		int temp;
		if( sp == 0 ) temp = sp;
		else temp = sfp;
		
		sp = (int)traitString.find_first_of("(", temp);
		ep = (int)traitString.find_first_of(")", temp);
		if(sp != (int)std::string::npos && ep != (int)std::string::npos)
		{
			// get inside of the parenthesis
			sp++;
			ep--;
			traitString.replace(sp, ep-sp+1, traitValue);
		}
		else
		{
			// string is corrupt
			std::cerr << "ERROR: Trait string missing parenthesis: " << traitString << std::endl;
			return;
		}
	}
	else
	{
		// trait not present in string
		if(traitString.length())
		{
			traitString = traitName + "=(" + traitValue + ") " + traitString;
		}
		else
		{
			traitString = traitName + "=(" + traitValue + ")";
		}

		return;
	}
}